

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.hh
# Opt level: O0

void __thiscall
avro::WriterImpl<avro::NullValidator>::writeValue(WriterImpl<avro::NullValidator> *this,float val)

{
  long in_RDI;
  undefined4 in_XMM0_Da;
  anon_union_4_2_947300a4 v;
  
  NullValidator::checkTypeExpected((NullValidator *)(in_RDI + 1),AVRO_FLOAT);
  OutputBuffer::writeTo<int>
            ((OutputBuffer *)CONCAT44(in_XMM0_Da,in_XMM0_Da),(int)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

void writeValue(float val) {
        validator_.checkTypeExpected(AVRO_FLOAT);
        union {
            float f;
            int32_t i;
        } v;
    
        v.f = val;
        buffer_.writeTo(v.i);
    }